

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O0

void ggml_backend_cpu_aarch64_buffer_set_tensor
               (ggml_backend_buffer_t buffer,ggml_tensor *tensor,void *data,size_t offset,
               size_t size)

{
  int iVar1;
  long lVar2;
  long in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  long in_R8;
  int OK;
  tensor_traits_base *tensor_traits;
  
  if (in_RCX != 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
               ,0x18bc,"GGML_ASSERT(%s) failed","offset == 0");
  }
  lVar2 = ggml_nbytes(in_RSI);
  if (in_R8 != lVar2) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
               ,0x18bd,"GGML_ASSERT(%s) failed","size == ggml_nbytes(tensor)");
  }
  iVar1 = (**(code **)(**(long **)(in_RSI + 0x140) + 0x20))
                    (*(long **)(in_RSI + 0x140),in_RSI,in_RDX,in_R8);
  if (iVar1 != 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
               ,0x18c2,"GGML_ASSERT(%s) failed","OK == 0");
  }
  return;
}

Assistant:

static void ggml_backend_cpu_aarch64_buffer_set_tensor(ggml_backend_buffer_t buffer, struct ggml_tensor * tensor,
                                                       const void * data, size_t offset, size_t size) {
    GGML_ASSERT(offset == 0);
    GGML_ASSERT(size == ggml_nbytes(tensor));

    auto tensor_traits = (ggml::cpu::aarch64::tensor_traits_base *) tensor->extra;
    auto OK            = tensor_traits->repack(tensor, data, size);

    GGML_ASSERT(OK == 0);
    GGML_UNUSED(buffer);
}